

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::BasicComputeTest::initPrograms
          (BasicComputeTest *this,SourceCollections *programCollection)

{
  ProgramSources *this_00;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [40];
  string local_30;
  
  TestCase::initPrograms((TestCase *)this,programCollection);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"basic_compute",&local_79);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout(local_size_x = 128) in;\nlayout(std430) buffer;\nlayout(binding = 0) readonly buffer Input0\n{\n  vec4 elements[];\n} input_data0;\nlayout(binding = 1) writeonly buffer Output\n{\n  vec4 elements[];\n} output_data;\nvoid main()\n{\n  uint ident = gl_GlobalInvocationID.x;\n  output_data.elements[ident] = input_data0.elements[ident] * input_data0.elements[ident];\n}"
             ,&local_7a);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_58,&local_78);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void BasicComputeTest::initPrograms(SourceCollections& programCollection) const
{
	TimestampTest::initPrograms(programCollection);

	programCollection.glslSources.add("basic_compute") << glu::ComputeSource(
		"#version 310 es\n"
		"layout(local_size_x = 128) in;\n"
		"layout(std430) buffer;\n"
		"layout(binding = 0) readonly buffer Input0\n"
		"{\n"
		"  vec4 elements[];\n"
		"} input_data0;\n"
		"layout(binding = 1) writeonly buffer Output\n"
		"{\n"
		"  vec4 elements[];\n"
		"} output_data;\n"
		"void main()\n"
		"{\n"
		"  uint ident = gl_GlobalInvocationID.x;\n"
		"  output_data.elements[ident] = input_data0.elements[ident] * input_data0.elements[ident];\n"
		"}");
}